

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::transfer_conserve_motion
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2verts,Graph *keys2elems,
               LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  array<bool,_3UL> *this;
  OpConservation op_conservation_00;
  bool bVar1;
  reference pvVar2;
  Read<int> local_290;
  Read<int> local_280;
  undefined1 local_26c [8];
  OpConservation op_conservation;
  Cavs local_250;
  undefined1 local_210 [8];
  CavsByBdryStatus cavs;
  Graph bdry_keys2doms;
  Read<int> local_108;
  Read<int> local_f8;
  Read<int> local_e8;
  Read<int> local_d8;
  Read<int> local_c8;
  Read<int> local_b8;
  undefined1 local_a8 [8];
  Cavs init_cavs;
  undefined1 local_58 [8];
  LOs prods2new_ents;
  LOs keys2prods;
  LOs *same_ents2old_ents_local;
  Graph *keys2elems_local;
  LOs *keys2verts_local;
  Mesh *new_mesh_local;
  TransferOpts *opts_local;
  Mesh *old_mesh_local;
  
  bVar1 = should_conserve_any(old_mesh,opts);
  if (bVar1) {
    Read<int>::Read((Read<int> *)&prods2new_ents.write_.shared_alloc_.direct_ptr,&keys2elems->a2ab);
    Read<int>::Read((Read<int> *)local_58,&keys2elems->ab2b);
    Read<int>::Read(&local_b8,keys2verts);
    Read<int>::Read(&local_c8,(Read<int> *)&prods2new_ents.write_.shared_alloc_.direct_ptr);
    Read<int>::Read(&local_d8,(Read<int> *)local_58);
    form_initial_cavs((Cavs *)local_a8,old_mesh,new_mesh,0,&local_b8,&local_c8,&local_d8);
    Read<int>::~Read(&local_d8);
    Read<int>::~Read(&local_c8);
    Read<int>::~Read(&local_b8);
    Read<int>::Read(&local_e8,(Read<int> *)local_a8);
    Read<int>::Read(&local_f8,
                    (Read<int> *)&init_cavs.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr);
    bVar1 = operator==(&local_e8,&local_f8);
    if (!bVar1) {
      fail("assertion %s failed at %s +%d\n",
           "init_cavs.keys2old_elems.a2ab == init_cavs.keys2new_elems.a2ab",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_conserve.cpp"
           ,0x21b);
    }
    Read<int>::~Read(&local_f8);
    Read<int>::~Read(&local_e8);
    Read<int>::Read(&local_108,
                    (Read<int> *)&init_cavs.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&bdry_keys2doms.ab2b.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&init_cavs.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr);
    bVar1 = operator==(&local_108,(Read<int> *)&bdry_keys2doms.ab2b.write_.shared_alloc_.direct_ptr)
    ;
    if (!bVar1) {
      fail("assertion %s failed at %s +%d\n",
           "init_cavs.keys2old_elems.ab2b == init_cavs.keys2new_elems.ab2b",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_conserve.cpp"
           ,0x21c);
    }
    Read<int>::~Read((Read<int> *)&bdry_keys2doms.ab2b.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read(&local_108);
    Graph::Graph((Graph *)&cavs._M_elems[2]._M_elems[2].
                           super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,keys2elems);
    Cavs::Cavs(&local_250,(Cavs *)local_a8);
    Read<int>::Read((Read<int> *)(op_conservation.density.always._M_elems + 1),keys2verts);
    separate_cavities((CavsByBdryStatus *)local_210,old_mesh,new_mesh,&local_250,0,
                      (LOs *)(op_conservation.density.always._M_elems + 1),
                      (Graph *)&cavs._M_elems[2]._M_elems[2].
                                super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    Read<int>::~Read((Read<int> *)(op_conservation.density.always._M_elems + 1));
    Cavs::~Cavs(&local_250);
    OpConservation::OpConservation((OpConservation *)local_26c);
    pvVar2 = std::array<bool,_3UL>::operator[]((array<bool,_3UL> *)local_26c,0);
    *pvVar2 = true;
    pvVar2 = std::array<bool,_3UL>::operator[]((array<bool,_3UL> *)local_26c,1);
    *pvVar2 = true;
    pvVar2 = std::array<bool,_3UL>::operator[]((array<bool,_3UL> *)local_26c,2);
    *pvVar2 = false;
    this = (array<bool,_3UL> *)(local_26c + 6);
    pvVar2 = std::array<bool,_3UL>::operator[](this,0);
    *pvVar2 = false;
    pvVar2 = std::array<bool,_3UL>::operator[](this,1);
    *pvVar2 = false;
    pvVar2 = std::array<bool,_3UL>::operator[](this,2);
    *pvVar2 = false;
    Read<int>::Read(&local_280,same_ents2old_ents);
    Read<int>::Read(&local_290,same_ents2new_ents);
    op_conservation_00.momentum.this_time._M_elems[2] =
         op_conservation.density.this_time._M_elems[0];
    op_conservation_00.momentum.always._M_elems[0] = op_conservation.density.this_time._M_elems[1];
    op_conservation_00.momentum.always._M_elems[1] = op_conservation.density.this_time._M_elems[2];
    op_conservation_00.momentum.always._M_elems[2] = op_conservation.density.always._M_elems[0];
    op_conservation_00.density.this_time._M_elems[0] = (bool)local_26c[0];
    op_conservation_00.density.this_time._M_elems[1] = (bool)local_26c[1];
    op_conservation_00.density.this_time._M_elems[2] = (bool)local_26c[2];
    op_conservation_00.density.always._M_elems[0] = (bool)local_26c[3];
    op_conservation_00.density.always._M_elems[1] = (bool)local_26c[4];
    op_conservation_00.density.always._M_elems[2] = (bool)local_26c[5];
    op_conservation_00.momentum.this_time._M_elems[0] = (bool)local_26c[6];
    op_conservation_00.momentum.this_time._M_elems[1] = (bool)local_26c[7];
    transfer_conservation_errors
              (old_mesh,opts,new_mesh,(CavsByBdryStatus *)local_210,&local_280,&local_290,
               op_conservation_00);
    Read<int>::~Read(&local_290);
    Read<int>::~Read(&local_280);
    std::array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
    ~array((array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
            *)local_210);
    Graph::~Graph((Graph *)&cavs._M_elems[2]._M_elems[2].
                            super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    Cavs::~Cavs((Cavs *)local_a8);
    Read<int>::~Read((Read<int> *)local_58);
    Read<int>::~Read((Read<int> *)&prods2new_ents.write_.shared_alloc_.direct_ptr);
  }
  return;
}

Assistant:

void transfer_conserve_motion(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, LOs keys2verts, Graph keys2elems, LOs same_ents2old_ents,
    LOs same_ents2new_ents) {
  if (!should_conserve_any(old_mesh, opts)) return;
  auto keys2prods = keys2elems.a2ab;
  auto prods2new_ents = keys2elems.ab2b;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, VERT, keys2verts, keys2prods, prods2new_ents);
  OMEGA_H_CHECK(init_cavs.keys2old_elems.a2ab == init_cavs.keys2new_elems.a2ab);
  OMEGA_H_CHECK(init_cavs.keys2old_elems.ab2b == init_cavs.keys2new_elems.ab2b);
  auto bdry_keys2doms = keys2elems;
  auto cavs = separate_cavities(
      old_mesh, new_mesh, init_cavs, VERT, keys2verts, &bdry_keys2doms);
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = false;
  op_conservation.momentum.this_time[NOT_BDRY] = false;
  op_conservation.momentum.this_time[TOUCH_BDRY] = false;
  op_conservation.momentum.this_time[KEY_BDRY] = false;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}